

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O3

void __thiscall
glslang::TBuiltIns::addSamplingFunctions
          (TBuiltIns *this,TSampler sampler,TString *typeName,int version,EProfile profile)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  byte bVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  uint uVar27;
  int iVar28;
  char *__s;
  uint uVar29;
  bool bVar30;
  uint uVar31;
  byte bVar32;
  bool bVar33;
  char *pcVar34;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  uint uVar35;
  uint uVar36;
  byte bVar37;
  bool bVar38;
  TString s;
  int local_160;
  long local_150;
  char local_13c;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_b0;
  ulong local_88;
  long local_80;
  char *local_78;
  char *local_70;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *local_40;
  TString *local_38;
  
  uVar35 = (uint)sampler & 0xff00;
  bVar38 = ((uint)sampler & 0x140000) == 0x100000;
  bVar1 = !bVar38;
  bVar32 = (byte)((uint)sampler >> 0x14);
  uVar29 = (uint)sampler & 0x20000;
  bVar37 = (byte)(uVar29 >> 0x11);
  uVar36 = (uint)sampler >> 8 & 0xff;
  uVar31 = (uint)sampler & 0xff;
  bVar25 = version < 0x1c2 || profile == EEsProfile;
  local_50 = "float ";
  if (uVar31 == 3) {
    local_50 = "float16_t ";
  }
  local_58 = ", float";
  if (uVar31 == 3) {
    local_58 = ", float16_t";
  }
  local_58 = local_58 + 2;
  local_60 = (this->super_TBuiltInParseables).stageBuiltins + 4;
  local_68 = (this->super_TBuiltInParseables).stageBuiltins + 5;
  local_40 = &(this->super_TBuiltInParseables).commonBuiltins;
  bVar15 = false;
  iVar6 = 0;
  local_38 = typeName;
  bVar14 = true;
  do {
    iVar7 = 0;
    bVar20 = false;
    if (bVar15) {
      if ((uVar35 | 0x200) == 0x600) {
        return;
      }
      bVar20 = uVar35 != 0x300 && uVar29 == 0;
      if (((uint)sampler & 0x150000) != 0x100000) {
        return;
      }
    }
    bVar19 = true;
    do {
      bVar10 = bVar19;
      bVar19 = bVar38;
      if (!bVar10) {
        if (((uVar35 == 0x500) || (uVar35 == 0x600)) ||
           ((((uint)sampler & 0x2ff00) == 0x20400 || ((uint)sampler & 0x3ff00) == 0x30200) || bVar1)
           ) break;
        bVar19 = false;
      }
      iVar8 = 0;
      bVar5 = true;
      do {
        bVar12 = bVar5;
        if ((!bVar12) &&
           ((!bVar19 ||
            ((((local_13c = sampler._1_1_, local_13c == '\x04' || (local_13c == '\x02')) &&
              (((uint)sampler & 0x30000) == 0x30000)) || ((uVar35 == 0x500 || (uVar35 == 0x600))))))
           )) break;
        iVar23 = 0;
        bVar5 = true;
        do {
          bVar16 = bVar5;
          local_88 = (ulong)(uint)(iVar23 + iVar6);
          if ((uint)(iVar8 + iVar7 + iVar23 + iVar6) < 4) {
            if ((!bVar16) && (((uVar35 | 0x200) == 0x600 || (((uint)sampler >> 0x12 & 1) != 0))))
            break;
            bVar5 = false;
            iVar23 = 0;
            bVar9 = true;
            do {
              bVar13 = bVar9;
              uVar27 = (int)local_88 + iVar23 + iVar8 + iVar7;
              if (uVar27 < 4) {
                if ((bool)(bVar5 & (iVar8 != 0 || iVar7 != 0))) break;
                if (bVar5) {
                  if (uVar35 == 0x400 || bVar37 != 0) break;
                }
                else if ((((uint)sampler >> 0x12 & 1) == 0 & bVar32 & uVar35 != 0x600) == 0)
                goto LAB_00486b30;
                local_70 = "sparseTexture";
                if (bVar5 != false) {
                  local_70 = "sparseTexel";
                }
                local_48 = "texture";
                if (bVar5 != false) {
                  local_48 = "texel";
                }
                bVar9 = false;
                iVar24 = 0;
                bVar18 = true;
                do {
                  bVar26 = bVar18;
                  if ((!(bool)(bVar9 & ((iVar8 != 0 || iVar7 != 0) || (uVar35 == 0x600 || bVar1))))
                     && (iVar24 + uVar27 < 4)) {
                    bVar18 = true;
                    do {
                      bVar11 = bVar18;
                      iVar28 = this->dimMap[uVar36] + ((uint)sampler >> 0x10 & 1);
                      iVar24 = 2;
                      if (2 < iVar28) {
                        iVar24 = iVar28;
                      }
                      if (uVar29 == 0) {
                        iVar24 = iVar28;
                      }
                      iVar24 = iVar24 + (uVar29 >> 0x11) + iVar6;
                      local_160 = 4;
                      if (uVar29 == 0) {
                        local_160 = iVar24;
                      }
                      if (iVar24 < 5) {
                        local_160 = iVar24;
                      }
                      if (4 < local_160) {
                        __assert_fail("totalDims <= 4",
                                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Initialize.cpp"
                                      ,0x1c68,
                                      "void glslang::TBuiltIns::addSamplingFunctions(TSampler, const TString &, int, EProfile)"
                                     );
                      }
                      if (!bVar11 && (bVar32 & 1 & bVar20) == 0) break;
                      bVar21 = 4 < iVar24 & bVar37;
                      bVar18 = true;
                      do {
                        bVar33 = bVar18;
                        local_150 = 1;
                        if (!bVar33) {
                          if (uVar31 != 3) break;
                          local_150 = 3;
                          if (uVar29 != 0) {
                            bVar2 = bVar21;
                            if (bVar21 == 0) {
                              bVar2 = 1;
                            }
                            local_160 = local_160 - ((byte)~bVar21 & 1);
                            bVar21 = bVar2;
                          }
                        }
                        if (bVar5 != false) {
                          local_150 = 8;
                        }
                        __s = ",float16_t";
                        if (bVar33) {
                          __s = ",float";
                        }
                        local_78 = ",f16vec";
                        if (bVar33) {
                          local_78 = ",vec";
                        }
                        local_80 = (long)local_160;
                        bVar30 = false;
                        bVar18 = false;
                        bVar3 = true;
                        do {
                          bVar22 = bVar3;
                          if ((bool)(((iVar23 != 0 || (iVar7 != 0 || iVar6 != 0)) || bVar25) &
                                    bVar30)) break;
                          bVar3 = false;
                          bVar17 = true;
                          do {
                            bVar4 = bVar17;
                            if (bVar4) {
                              local_b0._M_dataplus.super_allocator_type.allocator =
                                   GetThreadPoolAllocator();
                              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                              local_b0._M_string_length = 0;
                              local_b0.field_2._M_local_buf[0] = '\0';
                              pcVar34 = local_50;
                              if (uVar29 == 0) {
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,this->prefixes[uVar31]);
                                pcVar34 = "vec4 ";
                              }
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,pcVar34);
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,local_48);
                              pcVar34 = "Proj";
                              if (bVar15) goto LAB_00486773;
                            }
                            else {
                              if (((bVar25 || bVar15) || (uVar35 == 0x100)) || (uVar35 == 0x600))
                              break;
                              local_b0._M_dataplus.super_allocator_type.allocator =
                                   GetThreadPoolAllocator();
                              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                              local_b0._M_string_length = 0;
                              local_b0.field_2._M_local_buf[0] = '\0';
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,"int ");
                              pcVar34 = local_70;
LAB_00486773:
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,pcVar34);
                            }
                            if (!bVar10) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,"Lod");
                            }
                            if (bVar9) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,"Grad");
                            }
                            if (bVar5 != false) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,"Fetch");
                            }
                            if (!bVar16) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,"Offset");
                            }
                            if (bVar30) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,"Clamp");
                            }
                            if (bVar3 || bVar18) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,"ARB");
                            }
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::append(&local_b0,"(");
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::_M_append(&local_b0,(local_38->_M_dataplus)._M_p,
                                        local_38->_M_string_length);
                            if (bVar11) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,",");
                              if (local_160 == 1) {
                                pcVar34 = TType::getBasicString((TBasicType)local_150);
                              }
                              else {
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,this->prefixes[local_150]);
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,"vec");
                                pcVar34 = this->postfixes[local_80];
                              }
                            }
                            else if (bVar33) {
                              pcVar34 = ",vec4";
                            }
                            else {
                              pcVar34 = ",f16vec4";
                            }
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::append(&local_b0,pcVar34);
                            if (bVar21 != 0) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,",float");
                            }
                            if ((bVar5 != false) &&
                               (((uVar35 != 0x600 && (uVar35 != 0x500)) ||
                                (((byte)((uint)sampler >> 0x12) & 1 & bVar5) != 0)))) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,",int");
                            }
                            if (!bVar10) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,__s);
                            }
                            pcVar34 = local_78;
                            if (bVar9) {
                              if (this->dimMap[uVar36] == 1) {
                                if (bVar33) {
                                  pcVar34 = ",float,float";
                                }
                                else {
                                  pcVar34 = ",float16_t,float16_t";
                                }
                              }
                              else {
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,local_78);
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,this->postfixes[this->dimMap[uVar36]]);
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,pcVar34);
                                pcVar34 = this->postfixes[this->dimMap[uVar36]];
                              }
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,pcVar34);
                            }
                            if (!bVar16) {
                              if (this->dimMap[uVar36] == 1) {
                                pcVar34 = ",int";
                              }
                              else {
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,",ivec");
                                pcVar34 = this->postfixes[this->dimMap[uVar36]];
                              }
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,pcVar34);
                            }
                            if (bVar30) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,__s);
                            }
                            if (!bVar4) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,",out ");
                              pcVar34 = local_58;
                              if (uVar29 == 0) {
                                std::__cxx11::
                                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                ::append(&local_b0,this->prefixes[uVar31]);
                                pcVar34 = "vec4";
                              }
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,pcVar34);
                            }
                            if (!bVar12) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::append(&local_b0,__s);
                            }
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::append(&local_b0,");\n");
                            this_00 = local_40;
                            if (!(bool)((!bVar18 && iVar8 == 0) | bVar9)) {
                              std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              ::_M_append(local_60,local_b0._M_dataplus._M_p,
                                          local_b0._M_string_length);
                              this_00 = local_68;
                            }
                            std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::_M_append(this_00,local_b0._M_dataplus._M_p,local_b0._M_string_length)
                            ;
                            bVar3 = true;
                            bVar17 = false;
                          } while (bVar4);
                          bVar18 = true;
                          bVar30 = true;
                          bVar3 = false;
                        } while (bVar22);
                        bVar18 = false;
                      } while (bVar33);
                      bVar18 = false;
                    } while (bVar11);
                  }
                  iVar24 = 1;
                  bVar9 = true;
                  bVar18 = false;
                } while (bVar26);
              }
LAB_00486b30:
              iVar23 = 1;
              bVar5 = true;
              bVar9 = false;
            } while (bVar13);
          }
          iVar23 = 1;
          bVar5 = false;
        } while (bVar16);
        iVar8 = 1;
        bVar5 = false;
      } while (bVar12);
      iVar7 = 1;
      bVar19 = false;
    } while (bVar10);
    iVar6 = 1;
    bVar15 = true;
    bVar20 = !bVar14;
    bVar14 = false;
    if (bVar20) {
      return;
    }
  } while( true );
}

Assistant:

void TBuiltIns::addSamplingFunctions(TSampler sampler, const TString& typeName, int version, EProfile profile)
{
    //
    // texturing
    //
    for (int proj = 0; proj <= 1; ++proj) { // loop over "bool" projective or not

        if (proj && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.arrayed || sampler.isMultiSample()
            || !sampler.isCombined()))
            continue;

        for (int lod = 0; lod <= 1; ++lod) {

            if (lod && (sampler.isBuffer() || sampler.isRect() || sampler.isMultiSample() || !sampler.isCombined()))
                continue;
            if (lod && sampler.dim == Esd2D && sampler.arrayed && sampler.shadow)
                continue;
            if (lod && sampler.dim == EsdCube && sampler.shadow)
                continue;

            for (int bias = 0; bias <= 1; ++bias) {

                if (bias && (lod || sampler.isMultiSample() || !sampler.isCombined()))
                    continue;
                if (bias && (sampler.dim == Esd2D || sampler.dim == EsdCube) && sampler.shadow && sampler.arrayed)
                    continue;
                if (bias && (sampler.isRect() || sampler.isBuffer()))
                    continue;

                for (int offset = 0; offset <= 1; ++offset) { // loop over "bool" offset or not

                    if (proj + offset + bias + lod > 3)
                        continue;
                    if (offset && (sampler.dim == EsdCube || sampler.isBuffer() || sampler.isMultiSample()))
                        continue;

                    for (int fetch = 0; fetch <= 1; ++fetch) { // loop over "bool" fetch or not

                        if (proj + offset + fetch + bias + lod > 3)
                            continue;
                        if (fetch && (lod || bias))
                            continue;
                        if (fetch && (sampler.shadow || sampler.dim == EsdCube))
                            continue;
                        if (fetch == 0 && (sampler.isMultiSample() || sampler.isBuffer()
                            || !sampler.isCombined()))
                            continue;

                        for (int grad = 0; grad <= 1; ++grad) { // loop over "bool" grad or not

                            if (grad && (lod || bias || sampler.isMultiSample() || !sampler.isCombined()))
                                continue;
                            if (grad && sampler.isBuffer())
                                continue;
                            if (proj + offset + fetch + grad + bias + lod > 3)
                                continue;

                            for (int extraProj = 0; extraProj <= 1; ++extraProj) {
                                bool compare = false;
                                int totalDims = dimMap[sampler.dim] + (sampler.arrayed ? 1 : 0);
                                // skip dummy unused second component for 1D non-array shadows
                                if (sampler.shadow && totalDims < 2)
                                    totalDims = 2;
                                totalDims += (sampler.shadow ? 1 : 0) + proj;
                                if (totalDims > 4 && sampler.shadow) {
                                    compare = true;
                                    totalDims = 4;
                                }
                                assert(totalDims <= 4);

                                if (extraProj && ! proj)
                                    continue;
                                if (extraProj && (sampler.dim == Esd3D || sampler.shadow || !sampler.isCombined()))
                                    continue;

                                // loop over 16-bit floating-point texel addressing
                                for (int f16TexAddr = 0; f16TexAddr <= 1; ++f16TexAddr)
                                {
                                    if (f16TexAddr && sampler.type != EbtFloat16)
                                        continue;
                                    if (f16TexAddr && sampler.shadow && ! compare) {
                                        compare = true; // compare argument is always present
                                        totalDims--;
                                    }
                                    // loop over "bool" lod clamp
                                    for (int lodClamp = 0; lodClamp <= 1 ;++lodClamp)
                                    {
                                        if (lodClamp && (profile == EEsProfile || version < 450))
                                            continue;
                                        if (lodClamp && (proj || lod || fetch))
                                            continue;

                                        // loop over "bool" sparse or not
                                        for (int sparse = 0; sparse <= 1; ++sparse)
                                        {
                                            if (sparse && (profile == EEsProfile || version < 450))
                                                continue;
                                            // Sparse sampling is not for 1D/1D array texture, buffer texture, and
                                            // projective texture
                                            if (sparse && (sampler.is1D() || sampler.isBuffer() || proj))
                                                continue;

                                            TString s;

                                            // return type
                                            if (sparse)
                                                s.append("int ");
                                            else {
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t ");
                                                    else
                                                        s.append("float ");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4 ");
                                                }
                                            }

                                            // name
                                            if (sparse) {
                                                if (fetch)
                                                    s.append("sparseTexel");
                                                else
                                                    s.append("sparseTexture");
                                            }
                                            else {
                                                if (fetch)
                                                    s.append("texel");
                                                else
                                                    s.append("texture");
                                            }
                                            if (proj)
                                                s.append("Proj");
                                            if (lod)
                                                s.append("Lod");
                                            if (grad)
                                                s.append("Grad");
                                            if (fetch)
                                                s.append("Fetch");
                                            if (offset)
                                                s.append("Offset");
                                            if (lodClamp)
                                                s.append("Clamp");
                                            if (lodClamp != 0 || sparse)
                                                s.append("ARB");
                                            s.append("(");

                                            // sampler type
                                            s.append(typeName);
                                            // P coordinate
                                            if (extraProj) {
                                                if (f16TexAddr)
                                                    s.append(",f16vec4");
                                                else
                                                    s.append(",vec4");
                                            } else {
                                                s.append(",");
                                                TBasicType t = fetch ? EbtInt : (f16TexAddr ? EbtFloat16 : EbtFloat);
                                                if (totalDims == 1)
                                                    s.append(TType::getBasicString(t));
                                                else {
                                                    s.append(prefixes[t]);
                                                    s.append("vec");
                                                    s.append(postfixes[totalDims]);
                                                }
                                            }
                                            // non-optional compare
                                            if (compare)
                                                s.append(",float");

                                            // non-optional lod argument (lod that's not driven by lod loop) or sample
                                            if ((fetch && !sampler.isBuffer() &&
                                                 !sampler.isRect() && !sampler.isMultiSample())
                                                 || (sampler.isMultiSample() && fetch))
                                                s.append(",int");
                                            // non-optional lod
                                            if (lod) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }

                                            // gradient arguments
                                            if (grad) {
                                                if (dimMap[sampler.dim] == 1) {
                                                    if (f16TexAddr)
                                                        s.append(",float16_t,float16_t");
                                                    else
                                                        s.append(",float,float");
                                                } else {
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                    if (f16TexAddr)
                                                        s.append(",f16vec");
                                                    else
                                                        s.append(",vec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }
                                            // offset
                                            if (offset) {
                                                if (dimMap[sampler.dim] == 1)
                                                    s.append(",int");
                                                else {
                                                    s.append(",ivec");
                                                    s.append(postfixes[dimMap[sampler.dim]]);
                                                }
                                            }

                                            // lod clamp
                                            if (lodClamp) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            // texel out (for sparse texture)
                                            if (sparse) {
                                                s.append(",out ");
                                                if (sampler.shadow)
                                                    if (sampler.type == EbtFloat16)
                                                        s.append("float16_t");
                                                    else
                                                        s.append("float");
                                                else {
                                                    s.append(prefixes[sampler.type]);
                                                    s.append("vec4");
                                                }
                                            }
                                            // optional bias
                                            if (bias) {
                                                if (f16TexAddr)
                                                    s.append(",float16_t");
                                                else
                                                    s.append(",float");
                                            }
                                            s.append(");\n");

                                            // Add to the per-language set of built-ins
                                            if (!grad && (bias || lodClamp != 0)) {
                                                stageBuiltins[EShLangFragment].append(s);
                                                stageBuiltins[EShLangCompute].append(s);
                                            } else
                                                commonBuiltins.append(s);

                                        }
                                    }
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}